

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnscentedKalmanFilter.hpp
# Opt level: O3

State * __thiscall
Kalman::UnscentedKalmanFilter<KalmanExamples::Robot1::State<float>>::
update<KalmanExamples::Robot1::OrientationMeasurement<float>,Kalman::StandardBase>
          (UnscentedKalmanFilter<KalmanExamples::Robot1::State<float>> *this,
          MeasurementModelType<KalmanExamples::Robot1::OrientationMeasurement<float>,_Kalman::StandardBase>
          *m,OrientationMeasurement<float> *z)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined1 auStack_68 [8];
  SigmaPoints<KalmanExamples::Robot1::OrientationMeasurement<float>_> sigmaMeasurementPoints;
  KalmanGain<KalmanExamples::Robot1::OrientationMeasurement<float>_> K;
  OrientationMeasurement<float> y;
  Covariance<KalmanExamples::Robot1::OrientationMeasurement<float>_> P_yy;
  
  UnscentedKalmanFilterBase<KalmanExamples::Robot1::State<float>_>::
  computeSigmaPointMeasurements<KalmanExamples::Robot1::OrientationMeasurement<float>,_Kalman::StandardBase>
            ((UnscentedKalmanFilterBase<KalmanExamples::Robot1::State<float>_> *)this,m,
             (SigmaPoints<KalmanExamples::Robot1::OrientationMeasurement<float>_> *)auStack_68);
  K.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       *(float *)(this + 0x24) *
       sigmaMeasurementPoints.super_PlainObjectBase<Eigen::Matrix<float,_1,_7,_1,_1,_7>_>.m_storage.
       m_data.array[4] +
       *(float *)(this + 0x20) *
       sigmaMeasurementPoints.super_PlainObjectBase<Eigen::Matrix<float,_1,_7,_1,_1,_7>_>.m_storage.
       m_data.array[3] +
       *(float *)(this + 0x1c) *
       sigmaMeasurementPoints.super_PlainObjectBase<Eigen::Matrix<float,_1,_7,_1,_1,_7>_>.m_storage.
       m_data.array[2] +
       *(float *)(this + 0x18) *
       sigmaMeasurementPoints.super_PlainObjectBase<Eigen::Matrix<float,_1,_7,_1,_1,_7>_>.m_storage.
       m_data.array[1] + *(float *)(this + 0x10) * (float)auStack_68._4_4_ +
       *(float *)(this + 0x14) *
       sigmaMeasurementPoints.super_PlainObjectBase<Eigen::Matrix<float,_1,_7,_1,_1,_7>_>.m_storage.
       m_data.array[0] + *(float *)(this + 0xc) * (float)auStack_68._0_4_;
  K.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       *(float *)(this + 0x40) *
       (sigmaMeasurementPoints.super_PlainObjectBase<Eigen::Matrix<float,_1,_7,_1,_1,_7>_>.m_storage
        .m_data.array[4] -
       K.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]) *
       (sigmaMeasurementPoints.super_PlainObjectBase<Eigen::Matrix<float,_1,_7,_1,_1,_7>_>.m_storage
        .m_data.array[4] -
       K.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]) +
       *(float *)(this + 0x3c) *
       (sigmaMeasurementPoints.super_PlainObjectBase<Eigen::Matrix<float,_1,_7,_1,_1,_7>_>.m_storage
        .m_data.array[3] -
       K.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]) *
       (sigmaMeasurementPoints.super_PlainObjectBase<Eigen::Matrix<float,_1,_7,_1,_1,_7>_>.m_storage
        .m_data.array[3] -
       K.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]) +
       *(float *)(this + 0x38) *
       (sigmaMeasurementPoints.super_PlainObjectBase<Eigen::Matrix<float,_1,_7,_1,_1,_7>_>.m_storage
        .m_data.array[2] -
       K.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]) *
       (sigmaMeasurementPoints.super_PlainObjectBase<Eigen::Matrix<float,_1,_7,_1,_1,_7>_>.m_storage
        .m_data.array[2] -
       K.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]) +
       *(float *)(this + 0x34) *
       (sigmaMeasurementPoints.super_PlainObjectBase<Eigen::Matrix<float,_1,_7,_1,_1,_7>_>.m_storage
        .m_data.array[1] -
       K.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]) *
       (sigmaMeasurementPoints.super_PlainObjectBase<Eigen::Matrix<float,_1,_7,_1,_1,_7>_>.m_storage
        .m_data.array[1] -
       K.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]) +
       *(float *)(this + 0x2c) *
       ((float)auStack_68._4_4_ -
       K.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]) *
       ((float)auStack_68._4_4_ -
       K.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]) +
       *(float *)(this + 0x30) *
       (sigmaMeasurementPoints.super_PlainObjectBase<Eigen::Matrix<float,_1,_7,_1,_1,_7>_>.m_storage
        .m_data.array[0] -
       K.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]) *
       (sigmaMeasurementPoints.super_PlainObjectBase<Eigen::Matrix<float,_1,_7,_1,_1,_7>_>.m_storage
        .m_data.array[0] -
       K.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]) +
       *(float *)(this + 0x28) *
       ((float)auStack_68._0_4_ -
       K.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]) *
       ((float)auStack_68._0_4_ -
       K.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]) +
       (m->super_StandardBase<KalmanExamples::Robot1::OrientationMeasurement<float>_>).P.
       super_PlainObjectBase<Eigen::Matrix<float,_1,_1,_0,_1,_1>_>.m_storage.m_data.array[0];
  UnscentedKalmanFilter<KalmanExamples::Robot1::State<float>_>::
  computeKalmanGain<KalmanExamples::Robot1::OrientationMeasurement<float>_>
            ((UnscentedKalmanFilter<KalmanExamples::Robot1::State<float>_> *)this,
             (OrientationMeasurement<float> *)
             (K.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array +
             1),(SigmaPoints<KalmanExamples::Robot1::OrientationMeasurement<float>_> *)auStack_68,
             (Covariance<KalmanExamples::Robot1::OrientationMeasurement<float>_> *)
             (K.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array +
             2),(KalmanGain<KalmanExamples::Robot1::OrientationMeasurement<float>_> *)
                (sigmaMeasurementPoints.super_PlainObjectBase<Eigen::Matrix<float,_1,_7,_1,_1,_7>_>.
                 m_storage.m_data.array + 5));
  fVar1 = (z->super_Vector<float,_1>).super_Matrix<float,_1,_1>.
          super_PlainObjectBase<Eigen::Matrix<float,_1,_1,_0,_1,_1>_>.m_storage.m_data.array[0] -
          K.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1];
  *(float *)this =
       fVar1 * sigmaMeasurementPoints.super_PlainObjectBase<Eigen::Matrix<float,_1,_7,_1,_1,_7>_>.
               m_storage.m_data.array[5] + *(float *)this;
  *(float *)(this + 4) =
       fVar1 * sigmaMeasurementPoints.super_PlainObjectBase<Eigen::Matrix<float,_1,_7,_1,_1,_7>_>.
               m_storage.m_data.array[6] + *(float *)(this + 4);
  *(float *)(this + 8) =
       fVar1 * K.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
               [0] + *(float *)(this + 8);
  fVar2 = sigmaMeasurementPoints.super_PlainObjectBase<Eigen::Matrix<float,_1,_7,_1,_1,_7>_>.
          m_storage.m_data.array[5] *
          K.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2];
  fVar3 = sigmaMeasurementPoints.super_PlainObjectBase<Eigen::Matrix<float,_1,_7,_1,_1,_7>_>.
          m_storage.m_data.array[6] *
          K.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2];
  fVar1 = K.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] *
          K.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0];
  *(float *)(this + 0xac) =
       *(float *)(this + 0xac) -
       sigmaMeasurementPoints.super_PlainObjectBase<Eigen::Matrix<float,_1,_7,_1,_1,_7>_>.m_storage.
       m_data.array[5] * fVar2;
  *(float *)(this + 0xb0) =
       *(float *)(this + 0xb0) -
       sigmaMeasurementPoints.super_PlainObjectBase<Eigen::Matrix<float,_1,_7,_1,_1,_7>_>.m_storage.
       m_data.array[5] * fVar3;
  *(float *)(this + 0xb4) =
       *(float *)(this + 0xb4) -
       sigmaMeasurementPoints.super_PlainObjectBase<Eigen::Matrix<float,_1,_7,_1,_1,_7>_>.m_storage.
       m_data.array[5] * fVar1;
  *(float *)(this + 0xb8) =
       *(float *)(this + 0xb8) -
       sigmaMeasurementPoints.super_PlainObjectBase<Eigen::Matrix<float,_1,_7,_1,_1,_7>_>.m_storage.
       m_data.array[6] * fVar2;
  *(float *)(this + 0xbc) =
       *(float *)(this + 0xbc) -
       sigmaMeasurementPoints.super_PlainObjectBase<Eigen::Matrix<float,_1,_7,_1,_1,_7>_>.m_storage.
       m_data.array[6] * fVar3;
  *(float *)(this + 0xc0) =
       *(float *)(this + 0xc0) -
       sigmaMeasurementPoints.super_PlainObjectBase<Eigen::Matrix<float,_1,_7,_1,_1,_7>_>.m_storage.
       m_data.array[6] * fVar1;
  *(float *)(this + 0xc4) =
       *(float *)(this + 0xc4) -
       fVar2 * K.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
               [0];
  *(float *)(this + 200) =
       *(float *)(this + 200) -
       fVar3 * K.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
               [0];
  *(float *)(this + 0xcc) =
       *(float *)(this + 0xcc) -
       fVar1 * K.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
               [0];
  return (State *)this;
}

Assistant:

const State& update( const MeasurementModelType<Measurement, CovarianceBase>& m, const Measurement& z )
        {
            SigmaPoints<Measurement> sigmaMeasurementPoints;
            
            // Predict measurement (and corresponding sigma points)
            Measurement y = this->template computeMeasurementPrediction<Measurement, CovarianceBase>(m, sigmaMeasurementPoints);
            
            // Compute innovation covariance
            Covariance<Measurement> P_yy;
            computeCovarianceFromSigmaPoints(y, sigmaMeasurementPoints, m.getCovariance(), P_yy);
            
            KalmanGain<Measurement> K;
            computeKalmanGain(y, sigmaMeasurementPoints, P_yy, K);
            
            // Update state
            x += K * ( z - y );
            
            // Update state covariance
            updateStateCovariance<Measurement>(K, P_yy);
            
            return this->getState();
        }